

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.h
# Opt level: O3

int __thiscall CVmRun::init(CVmRun *this,EVP_PKEY_CTX *ctx)

{
  sp_ = (this->super_CVmStack).arr_;
  r0_.typ = VM_NIL;
  frame_ptr_ = (vm_val_t *)0x0;
  entry_ptr_native_ = (uchar *)0x0;
  this->halt_vm_ = 0;
  this->funchdr_size_ = 0;
  this->say_func_ = (vm_globalvar_t *)0x0;
  this->say_method_ = 0;
  pc_ptr_ = (uchar **)0x0;
  return 0;
}

Assistant:

void init()
    {
        /* start the stack pointer at the first element */
        sp_ = arr_;
    }